

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_tri_uv_bounding_box2
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL *uv_min,REF_DBL *uv_max)

{
  double dVar1;
  double dVar2;
  REF_CELL ref_cell;
  REF_GEOM pRVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  REF_INT ncell;
  long local_d8;
  REF_GEOM local_d0;
  REF_INT sense;
  REF_INT cells [2];
  REF_DBL uv [2];
  REF_INT nodes [27];
  
  ref_cell = ref_grid->cell[3];
  pRVar3 = ref_grid->geom;
  uVar4 = ref_cell_list_with2(ref_cell,node0,node1,2,&ncell,cells);
  if (uVar4 == 0) {
    if ((long)ncell == 2) {
      *uv_min = 1e+200;
      uv_min[1] = 1e+200;
      *uv_max = -1e+200;
      uv_max[1] = -1e+200;
      local_d0 = pRVar3;
      iVar5 = 2;
      for (local_d8 = 0; uVar4 = 0, local_d8 < iVar5; local_d8 = local_d8 + 1) {
        uVar4 = ref_cell_nodes(ref_cell,cells[local_d8],nodes);
        if (uVar4 != 0) {
          pcVar9 = "cell nodes";
          uVar7 = 0x5ed;
LAB_00183923:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 uVar7,"ref_geom_tri_uv_bounding_box2",(ulong)uVar4,pcVar9);
          return uVar4;
        }
        for (lVar8 = 0; lVar8 < ref_cell->node_per; lVar8 = lVar8 + 1) {
          uVar4 = ref_geom_cell_tuv(local_d0,nodes[lVar8],nodes,2,uv,&sense);
          if (uVar4 != 0) {
            pcVar9 = "cell uv";
            uVar7 = 0x5f1;
            goto LAB_00183923;
          }
          for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
            dVar1 = uv_min[lVar6];
            uVar10 = SUB84(dVar1,0);
            uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
            dVar2 = uv[lVar6];
            if (dVar2 <= dVar1) {
              uVar10 = SUB84(dVar2,0);
              uVar11 = (undefined4)((ulong)dVar2 >> 0x20);
            }
            uv_min[lVar6] = (REF_DBL)CONCAT44(uVar11,uVar10);
          }
          for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
            dVar1 = uv_max[lVar6];
            uVar10 = SUB84(dVar1,0);
            uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
            dVar2 = uv[lVar6];
            if (dVar1 <= dVar2) {
              uVar10 = SUB84(dVar2,0);
              uVar11 = (undefined4)((ulong)dVar2 >> 0x20);
            }
            uv_max[lVar6] = (REF_DBL)CONCAT44(uVar11,uVar10);
          }
        }
        iVar5 = ncell;
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5e7,
             "ref_geom_tri_uv_bounding_box2","expected two tri for box2 nodes",2,(long)ncell);
      uVar4 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5e6,
           "ref_geom_tri_uv_bounding_box2",(ulong)uVar4,"list");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_uv_bounding_box2(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_DBL *uv_min,
                                                 REF_DBL *uv_max) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, cell_node, iuv;
  REF_DBL uv[2];
  REF_INT i, ncell, cells[2];
  REF_INT sense;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  REIS(2, ncell, "expected two tri for box2 nodes");

  for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = REF_DBL_MAX;
  for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = REF_DBL_MIN;
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_geom_cell_tuv(ref_geom, nodes[cell_node], nodes, REF_GEOM_FACE,
                            uv, &sense),
          "cell uv");
      for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = MIN(uv_min[iuv], uv[iuv]);
      for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = MAX(uv_max[iuv], uv[iuv]);
    }
  }

  return REF_SUCCESS;
}